

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O2

int Map_LibraryDeriveGateInfo(Map_SuperLib_t *pLib,st__table *tExcludeGate)

{
  float *pfVar1;
  Map_Super_t *pGate;
  Map_Super_t *pMVar2;
  int iVar3;
  Mio_PinPhase_t MVar4;
  char *pcVar5;
  ulong uVar6;
  Mio_Pin_t *pPin;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  uint uCanon [2];
  uint uTruths [6] [2];
  
  lVar9 = (long)pLib->nVarsMax;
  do {
    if (pLib->nLines <= lVar9) {
      Map_SuperTableSortSupergatesByDelay(pLib->tTableC,pLib->nSupersAll);
      return 1;
    }
    pGate = pLib->ppSupers[lVar9];
    if (tExcludeGate != (st__table *)0x0) {
      pcVar5 = Mio_GateReadName(pGate->pRoot);
      iVar3 = st__lookup(tExcludeGate,pcVar5,(char **)0x0);
      uVar8 = *(uint *)&pGate->field_0x4;
      if (iVar3 != 0) {
        uVar8 = uVar8 | 2;
        *(uint *)&pGate->field_0x4 = uVar8;
      }
      for (uVar6 = 0; uVar6 < (uVar8 >> 2 & 7); uVar6 = uVar6 + 1) {
        if ((pGate->pFanins[uVar6]->field_0x4 & 2) != 0) {
          uVar8 = uVar8 | 2;
          *(uint *)&pGate->field_0x4 = uVar8;
        }
      }
    }
    for (uVar6 = 0; uVar8 = *(uint *)&pGate->field_0x4 >> 2 & 7, uVar6 < uVar8; uVar6 = uVar6 + 1) {
      pMVar2 = pGate->pFanins[uVar6];
      uTruths[uVar6][0] = pMVar2->uTruth[0];
      uTruths[uVar6][1] = pMVar2->uTruth[1];
    }
    Mio_DeriveTruthTable(pGate->pRoot,uTruths,uVar8,6,pGate->uTruth);
    uVar6 = (ulong)(uint)pLib->nVarsMax;
    if (pLib->nVarsMax < 1) {
      uVar6 = 0;
    }
    for (lVar10 = 0; uVar6 * 0xc - lVar10 != 0; lVar10 = lVar10 + 0xc) {
      *(undefined8 *)((long)&pGate->tDelaysR[0].Rise + lVar10) = 0xc61c3c00c61c3c00;
      *(undefined8 *)((long)&pGate->tDelaysF[0].Rise + lVar10) = 0xc61c3c00c61c3c00;
    }
    pPin = Mio_GateReadPins(pGate->pRoot);
    for (uVar6 = 0; uVar8 = *(uint *)&pGate->field_0x4, uVar6 < (uVar8 >> 2 & 7); uVar6 = uVar6 + 1)
    {
      if (pPin == (Mio_Pin_t *)0x0) {
        pcVar5 = "There are less pins than gate inputs.";
        goto LAB_00369d06;
      }
      pMVar2 = pGate->pFanins[uVar6];
      MVar4 = Mio_PinReadPhase(pPin);
      dVar13 = Mio_PinReadDelayBlockRise(pPin);
      fVar11 = (float)dVar13;
      dVar13 = Mio_PinReadDelayBlockFall(pPin);
      fVar12 = (float)dVar13;
      uVar8 = pLib->nVarsMax;
      if (MVar4 == MIO_PHASE_INV) {
        uVar7 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar7 = 0;
        }
LAB_00369a90:
        for (lVar10 = 0; uVar7 * 0xc - lVar10 != 0; lVar10 = lVar10 + 0xc) {
          fVar14 = *(float *)((long)&pMVar2->tDelaysF[0].Rise + lVar10);
          if ((0.0 <= fVar14) &&
             (fVar14 = fVar14 + fVar11, pfVar1 = (float *)((long)&pGate->tDelaysR[0].Rise + lVar10),
             *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
            *(float *)((long)&pGate->tDelaysR[0].Rise + lVar10) = fVar14;
          }
          fVar14 = *(float *)((long)&pMVar2->tDelaysF[0].Fall + lVar10);
          if ((0.0 <= fVar14) &&
             (fVar14 = fVar14 + fVar11, pfVar1 = (float *)((long)&pGate->tDelaysR[0].Fall + lVar10),
             *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
            *(float *)((long)&pGate->tDelaysR[0].Fall + lVar10) = fVar14;
          }
          fVar14 = *(float *)((long)&pMVar2->tDelaysR[0].Rise + lVar10);
          if ((0.0 <= fVar14) &&
             (fVar14 = fVar14 + fVar12, pfVar1 = (float *)((long)&pGate->tDelaysF[0].Rise + lVar10),
             *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
            *(float *)((long)&pGate->tDelaysF[0].Rise + lVar10) = fVar14;
          }
          fVar14 = *(float *)((long)&pMVar2->tDelaysR[0].Fall + lVar10);
          if ((0.0 <= fVar14) &&
             (fVar14 = fVar14 + fVar12, pfVar1 = (float *)((long)&pGate->tDelaysF[0].Fall + lVar10),
             *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
            *(float *)((long)&pGate->tDelaysF[0].Fall + lVar10) = fVar14;
          }
        }
      }
      else {
        uVar7 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar7 = 0;
        }
        for (lVar10 = 0; uVar7 * 0xc - lVar10 != 0; lVar10 = lVar10 + 0xc) {
          fVar14 = *(float *)((long)&pMVar2->tDelaysR[0].Rise + lVar10);
          if ((0.0 <= fVar14) &&
             (fVar14 = fVar14 + fVar11, pfVar1 = (float *)((long)&pGate->tDelaysR[0].Rise + lVar10),
             *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
            *(float *)((long)&pGate->tDelaysR[0].Rise + lVar10) = fVar14;
          }
          fVar14 = *(float *)((long)&pMVar2->tDelaysR[0].Fall + lVar10);
          if ((0.0 <= fVar14) &&
             (fVar14 = fVar14 + fVar11, pfVar1 = (float *)((long)&pGate->tDelaysR[0].Fall + lVar10),
             *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
            *(float *)((long)&pGate->tDelaysR[0].Fall + lVar10) = fVar14;
          }
          fVar14 = *(float *)((long)&pMVar2->tDelaysF[0].Rise + lVar10);
          if ((0.0 <= fVar14) &&
             (fVar14 = fVar14 + fVar12, pfVar1 = (float *)((long)&pGate->tDelaysF[0].Rise + lVar10),
             *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
            *(float *)((long)&pGate->tDelaysF[0].Rise + lVar10) = fVar14;
          }
          fVar14 = *(float *)((long)&pMVar2->tDelaysF[0].Fall + lVar10);
          if ((0.0 <= fVar14) &&
             (fVar14 = fVar14 + fVar12, pfVar1 = (float *)((long)&pGate->tDelaysF[0].Fall + lVar10),
             *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
            *(float *)((long)&pGate->tDelaysF[0].Fall + lVar10) = fVar14;
          }
        }
        if (MVar4 != MIO_PHASE_NONINV) goto LAB_00369a90;
      }
      pPin = Mio_PinReadNext(pPin);
    }
    if (pPin != (Mio_Pin_t *)0x0) {
      pcVar5 = "There are more pins than gate inputs.";
LAB_00369d06:
      puts(pcVar5);
      return 0;
    }
    (pGate->tDelayMax).Rise = -9999.0;
    (pGate->tDelayMax).Fall = -9999.0;
    uVar6 = (ulong)(uint)pLib->nVarsMax;
    if (pLib->nVarsMax < 1) {
      uVar6 = 0;
    }
    fVar12 = -9999.0;
    fVar11 = -9999.0;
    for (lVar10 = 0; uVar6 * 0xc - lVar10 != 0; lVar10 = lVar10 + 0xc) {
      fVar14 = *(float *)((long)&pGate->tDelaysR[0].Rise + lVar10);
      if (fVar12 < fVar14) {
        (pGate->tDelayMax).Rise = fVar14;
        fVar12 = fVar14;
      }
      fVar14 = *(float *)((long)&pGate->tDelaysR[0].Fall + lVar10);
      if (fVar12 < fVar14) {
        (pGate->tDelayMax).Rise = fVar14;
        fVar12 = fVar14;
      }
      fVar14 = *(float *)((long)&pGate->tDelaysF[0].Rise + lVar10);
      if (fVar11 < fVar14) {
        (pGate->tDelayMax).Fall = fVar14;
        fVar11 = fVar14;
      }
      fVar15 = *(float *)((long)&pGate->tDelaysF[0].Fall + lVar10);
      if (fVar11 < fVar15) {
        (pGate->tDelayMax).Fall = fVar15;
        fVar11 = fVar15;
        fVar15 = *(float *)((long)&pGate->tDelaysF[0].Fall + lVar10);
      }
      if (fVar15 <= fVar14) {
        fVar15 = fVar14;
      }
      *(float *)((long)&pGate->tDelaysF[0].Worst + lVar10) = fVar15;
      fVar14 = *(float *)((long)&pGate->tDelaysR[0].Fall + lVar10);
      fVar15 = *(float *)((long)&pGate->tDelaysR[0].Rise + lVar10);
      if (fVar14 <= fVar15) {
        fVar14 = fVar15;
      }
      *(float *)((long)&pGate->tDelaysR[0].Worst + lVar10) = fVar14;
    }
    *(uint *)&pGate->field_0x4 = uVar8 & 0xffffff1f | 0x20;
    dVar13 = Mio_GateReadArea(pGate->pRoot);
    fVar11 = (float)dVar13;
    pGate->Area = fVar11;
    uVar8 = *(uint *)&pGate->field_0x4;
    for (uVar6 = 0; uVar6 < (uVar8 >> 2 & 7); uVar6 = uVar6 + 1) {
      pMVar2 = pGate->pFanins[uVar6];
      uVar8 = uVar8 & 0xffffff1f | (uVar8 & 0xe0) + *(int *)&pMVar2->field_0x4 & 0xe0;
      *(uint *)&pGate->field_0x4 = uVar8;
      fVar11 = fVar11 + pMVar2->Area;
      pGate->Area = fVar11;
    }
    if ((uVar8 & 3) == 1) {
      iVar3 = Map_LibraryGetMaxSuperPi_rec(pGate);
      if ((iVar3 < 0) || (pLib->nVarsMax <= iVar3)) {
        __assert_fail("nRealVars > 0 && nRealVars <= pLib->nVarsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTree.c"
                      ,0x2af,"int Map_LibraryDeriveGateInfo(Map_SuperLib_t *, st__table *)");
      }
      iVar3 = Map_CanonComputeSlow
                        (pLib->uTruths,pLib->nVarsMax,iVar3 + 1,pGate->uTruth,pGate->uPhases,uCanon)
      ;
      *(uint *)&pGate->field_0x4 = *(uint *)&pGate->field_0x4 & 0xfffffff | iVar3 << 0x1c;
      Map_SuperTableInsertC(pLib->tTableC,uCanon,pGate);
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int Map_LibraryDeriveGateInfo( Map_SuperLib_t * pLib, st__table * tExcludeGate )
{
    Map_Super_t * pGate, * pFanin;
    Mio_Pin_t * pPin;
    unsigned uCanon[2];
    unsigned uTruths[6][2];
    int i, k, nRealVars;

    // set all the derivable info related to the supergates
    for ( i = pLib->nVarsMax; i < (int)pLib->nLines; i++ )
    {
        pGate = pLib->ppSupers[i];

        if ( tExcludeGate )
        {
            if ( st__is_member( tExcludeGate, Mio_GateReadName( pGate->pRoot ) ) )
                pGate->fExclude = 1;
            for ( k = 0; k < (int)pGate->nFanins; k++ )
            {
                pFanin = pGate->pFanins[k];
                if ( pFanin->fExclude )
                {
                    pGate->fExclude = 1;
                    continue;
                }
            }
        }
        
        // collect the truth tables of the fanins
        for ( k = 0; k < (int)pGate->nFanins; k++ )
        {
            pFanin = pGate->pFanins[k];
            uTruths[k][0] = pFanin->uTruth[0];
            uTruths[k][1] = pFanin->uTruth[1];
        }
        // derive the new truth table
        Mio_DeriveTruthTable( pGate->pRoot, uTruths, pGate->nFanins, 6, pGate->uTruth );

        // set the initial delays of the supergate
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            pGate->tDelaysR[k].Rise = pGate->tDelaysR[k].Fall = MAP_NO_VAR;
            pGate->tDelaysF[k].Rise = pGate->tDelaysF[k].Fall = MAP_NO_VAR;
        }
        // get the linked list of pins for the given root gate
        pPin = Mio_GateReadPins( pGate->pRoot );
        // update the initial delay of the supergate using info from the corresponding pin
        for ( k = 0; k < (int)pGate->nFanins; k++, pPin = Mio_PinReadNext(pPin) )
        {
            // if there is no corresponding pin, this is a bug, return fail
            if ( pPin == NULL )
            {
                printf( "There are less pins than gate inputs.\n" );
                return 0;
            }
            // update the delay information of k-th fanins info from the corresponding pin
            Map_LibraryAddFaninDelays( pLib, pGate, pGate->pFanins[k], pPin );
        }
        // if there are some pins left, this is a bug, return fail
        if ( pPin != NULL )
        {
            printf( "There are more pins than gate inputs.\n" );
            return 0;
        }
        // find the max delay
        pGate->tDelayMax.Rise = pGate->tDelayMax.Fall = MAP_NO_VAR;
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            // the rise of the output depends on the rise and fall of the output
            if ( pGate->tDelayMax.Rise < pGate->tDelaysR[k].Rise )
                pGate->tDelayMax.Rise = pGate->tDelaysR[k].Rise;
            if ( pGate->tDelayMax.Rise < pGate->tDelaysR[k].Fall )
                pGate->tDelayMax.Rise = pGate->tDelaysR[k].Fall;
            // the fall of the output depends on the rise and fall of the output
            if ( pGate->tDelayMax.Fall < pGate->tDelaysF[k].Rise )
                pGate->tDelayMax.Fall = pGate->tDelaysF[k].Rise;
            if ( pGate->tDelayMax.Fall < pGate->tDelaysF[k].Fall )
                pGate->tDelayMax.Fall = pGate->tDelaysF[k].Fall;

            pGate->tDelaysF[k].Worst = MAP_MAX( pGate->tDelaysF[k].Fall, pGate->tDelaysF[k].Rise );
            pGate->tDelaysR[k].Worst = MAP_MAX( pGate->tDelaysR[k].Fall, pGate->tDelaysR[k].Rise );
        }

        // count gates and area of the supergate
        pGate->nGates = 1;
        pGate->Area   = (float)Mio_GateReadArea(pGate->pRoot);
        for ( k = 0; k < (int)pGate->nFanins; k++ )
        {
            pGate->nGates += pGate->pFanins[k]->nGates;
            pGate->Area   += pGate->pFanins[k]->Area;
        }
        // do not add the gate to the table, if this gate is an internal gate
        // of some supegate and does not correspond to a supergate output
        if ( ( !pGate->fSuper ) || pGate->fExclude )
            continue;

        // find the maximum index of a variable in the support of the supergates
        // this is important for two reasons:
        // (1) to limit the number of permutations considered for canonicization
        // (2) to get rid of equivalence phases to speed-up matching
        nRealVars = Map_LibraryGetMaxSuperPi_rec( pGate ) + 1;
        assert( nRealVars > 0 && nRealVars <= pLib->nVarsMax );
        // if there are some problems with this code, try this instead
//        nRealVars = pLib->nVarsMax;

        // find the N-canonical form of this supergate
        pGate->nPhases = Map_CanonComputeSlow( pLib->uTruths, pLib->nVarsMax, nRealVars, pGate->uTruth, pGate->uPhases, uCanon );
        // add the supergate into the table by its N-canonical table
        Map_SuperTableInsertC( pLib->tTableC, uCanon, pGate );
/*
        {
            int uCanon1, uCanon2;
            uCanon1 = uCanon[0];
            pGate->uTruth[0] = ~pGate->uTruth[0];
            pGate->uTruth[1] = ~pGate->uTruth[1];
            Map_CanonComputeSlow( pLib->uTruths, pLib->nVarsMax, nRealVars, pGate->uTruth, pGate->uPhases, uCanon );
            uCanon2 = uCanon[0];
Rwt_Man5ExploreCount( uCanon1 < uCanon2 ? uCanon1 : uCanon2 );
        }
*/
    }
    // sort the gates in each line
    Map_SuperTableSortSupergatesByDelay( pLib->tTableC, pLib->nSupersAll );

    // let the glory be manifest
//    Map_LibraryPrintTree( pLib );
    return 1;
}